

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# injectionmanager.h
# Opt level: O3

void injection::InjectionManager::bind_singleton<ITest>(ITest *singleton)

{
  _Any_data local_30;
  code *local_20;
  code *local_18;
  undefined1 local_10 [8];
  
  local_30._M_unused._M_object = local_10;
  local_30._8_8_ = 0;
  local_18 = std::
             _Function_handler<ITest_*(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/reyesr[P]injection/include/injectionmanager.h:130:35)>
             ::_M_invoke;
  local_20 = std::
             _Function_handler<ITest_*(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/reyesr[P]injection/include/injectionmanager.h:130:35)>
             ::_M_manager;
  bind<ITest>((function<ITest_*()> *)&local_30,SINGLETON_EAGER);
  if (local_20 != (code *)0x0) {
    (*local_20)(&local_30,&local_30,__destroy_functor);
  }
  return;
}

Assistant:

static void bind_singleton(I* singleton) {
        InjectionManager::bind<I>([&singleton](){return singleton;}, InjectionScope::SINGLETON_EAGER);
    }